

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkMiterQuantifyPis(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  int i;
  
  if (pNtk->nObjCounts[8] == pNtk->vBoxes->nSize) {
    for (i = 0; i < pNtk->vPis->nSize; i = i + 1) {
      pAVar1 = Abc_NtkPi(pNtk,i);
      pAVar2 = pNtk;
      if ((pAVar1->vFanouts).nSize != 0) {
        pAVar2 = Abc_NtkMiterQuantify(pNtk,i,1);
        Abc_NtkDelete(pNtk);
      }
      pNtk = pAVar2;
    }
    return pNtk;
  }
  __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                ,0x28d,"Abc_Ntk_t *Abc_NtkMiterQuantifyPis(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterQuantifyPis( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkTemp;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        if ( Abc_ObjFanoutNum(pObj) == 0 )
            continue;
        pNtk = Abc_NtkMiterQuantify( pNtkTemp = pNtk, i, 1 );
        Abc_NtkDelete( pNtkTemp );
    }

    return pNtk;
}